

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O0

void __thiscall
ProtocolARP::Add(ProtocolARP *this,uint8_t *protocolAddress,uint8_t *hardwareAddress)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  ulong local_40;
  size_t j_1;
  size_t j;
  uint local_28;
  int oldest;
  uint32_t i;
  int index;
  uint8_t *hardwareAddress_local;
  uint8_t *protocolAddress_local;
  ProtocolARP *this_local;
  
  iVar1 = LocateProtocolAddress(this,protocolAddress);
  if (iVar1 < 0) {
    local_28 = 0;
    while ((local_28 < 5 && (this->Cache[local_28].Age != '\0'))) {
      local_28 = local_28 + 1;
    }
    if (local_28 == 5) {
      j._4_4_ = 0;
      for (local_28 = 1; local_28 < 5; local_28 = local_28 + 1) {
        if (this->Cache[(int)j._4_4_].Age < this->Cache[local_28].Age) {
          j._4_4_ = local_28;
        }
      }
      local_28 = j._4_4_;
    }
    this->Cache[local_28].Age = '\x01';
    for (j_1 = 0; sVar2 = ProtocolIPv4::AddressSize(this->IP), j_1 < sVar2; j_1 = j_1 + 1) {
      this->Cache[local_28].IPv4Address[j_1] = protocolAddress[j_1];
    }
    for (local_40 = 0; iVar1 = (*this->MAC->_vptr_InterfaceMAC[3])(),
        local_40 < CONCAT44(extraout_var,iVar1); local_40 = local_40 + 1) {
      this->Cache[local_28].MACAddress[local_40] = hardwareAddress[local_40];
    }
  }
  else {
    this->Cache[iVar1].Age = '\x01';
  }
  for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
    if ((this->Cache[local_28].Age != '\0') &&
       (this->Cache[local_28].Age = this->Cache[local_28].Age + '\x01',
       this->Cache[local_28].Age == 0xff)) {
      this->Cache[local_28].Age = '\0';
    }
  }
  return;
}

Assistant:

void ProtocolARP::Add(const uint8_t* protocolAddress, const uint8_t* hardwareAddress)
{
    int index;
    uint32_t i;
    int oldest;

    index = LocateProtocolAddress(protocolAddress);
    if (index >= 0)
    {
        // Found entry in table, reset it's age
        Cache[index].Age = 1;
    }
    else
    {
        // Not already in table;
        for (i = 0; i < ARPCacheSize; i++)
        {
            if (Cache[i].Age == 0)
            {
                // Entry not used, take it
                break;
            }
        }
        if (i == ARPCacheSize)
        {
            // Table is full, steal the oldest entry
            oldest = 0;
            for (i = 1; i < ARPCacheSize; i++)
            {
                if (Cache[i].Age > Cache[oldest].Age)
                {
                    oldest = i;
                }
            }
            i = oldest;
        }

        // At this point i is the entry we want to use
        Cache[i].Age = 1;
        for (size_t j = 0; j < IP.AddressSize(); j++)
        {
            Cache[i].IPv4Address[j] = protocolAddress[j];
        }
        for (size_t j = 0; j < MAC.AddressSize(); j++)
        {
            Cache[i].MACAddress[j] = hardwareAddress[j];
        }
    }

    // Age the list
    for (i = 0; i < ARPCacheSize; i++)
    {
        if (Cache[i].Age != 0)
        {
            Cache[i].Age++;
            if (Cache[i].Age == 0xFF)
            {
                // Flush this entry
                Cache[i].Age = 0;
            }
        }
    }
}